

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

bool GetTypeConstructorFunctions
               (ExpressionContext *ctx,TypeBase *type,bool noArguments,
               SmallArray<FunctionData_*,_32U> *functions)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  bool bVar9;
  uint uVar10;
  ArgumentData *pAVar11;
  TypeClass *classType;
  InplaceStr IVar12;
  ArrayView<FunctionData_*> functions_00;
  ArrayView<FunctionData_*> functions_01;
  ArrayView<FunctionData_*> functions_02;
  ArrayView<FunctionData_*> functions_03;
  FunctionLookupChain chain;
  TypeGenericClassProto *local_80;
  FunctionLookupChain local_78;
  FunctionLookupChain local_58;
  ExpressionContext *local_40;
  uint local_34;
  
  bVar9 = true;
  if (type == (TypeBase *)0x0) {
    classType = (TypeClass *)0x0;
    local_80 = (TypeGenericClassProto *)0x0;
  }
  else {
    classType = (TypeClass *)0x0;
    local_80 = (TypeGenericClassProto *)0x0;
    if (type->typeID == 0x16) {
      local_80 = (TypeGenericClassProto *)type;
    }
    if (type->typeID == 0x18) {
      if (*(TypeGenericClassProto **)&type[2].typeIndex != (TypeGenericClassProto *)0x0) {
        local_80 = *(TypeGenericClassProto **)&type[2].typeIndex;
      }
      bVar9 = false;
      classType = (TypeClass *)type;
    }
  }
  local_40 = ctx;
  uVar10 = NULLC::StringHashContinue(type->nameHash,"::");
  if (bVar9) {
    IVar12 = type->name;
  }
  else {
    IVar12 = GetTypeConstructorName(classType);
  }
  local_34 = NULLC::StringHashContinue(uVar10,IVar12.begin,IVar12.end);
  anon_unknown.dwarf_b837c::LookupFunctionChainByName(&local_78,local_40,local_34);
  while (local_78.node.node != (Node *)0x0) {
    if ((((!noArguments) || (*(int *)(*(long *)(local_78.node.node + 0x10) + 0x78) == 0)) ||
        (pAVar11 = SmallArray<ArgumentData,_4U>::operator[]
                             ((SmallArray<ArgumentData,_4U> *)
                              (*(long *)(local_78.node.node + 0x10) + 0x70),0),
        pAVar11->value != (ExprBase *)0x0)) &&
       (((*(FunctionData **)(local_78.node.node + 0x10))->scope->ownerType == type &&
        (uVar1 = functions->data, uVar2 = functions->count, functions_00.count = uVar2,
        functions_00.data = (FunctionData **)uVar1, functions_00._12_4_ = 0,
        bVar9 = ContainsSameOverload(functions_00,*(FunctionData **)(local_78.node.node + 0x10)),
        !bVar9)))) {
      local_58.node.start = *(Node **)(local_78.node.node + 0x10);
      SmallArray<FunctionData_*,_32U>::push_back(functions,(FunctionData **)&local_58);
    }
    anon_unknown.dwarf_b837c::FunctionLookupChain::next(&local_58,&local_78);
    local_78.node.start = local_58.node.start;
    local_78.node.node = local_58.node.node;
  }
  if (local_80 != (TypeGenericClassProto *)0x0) {
    uVar10 = NULLC::StringHashContinue((local_80->super_TypeBase).nameHash,"::");
    IVar12 = GetTypeConstructorName(local_80);
    uVar10 = NULLC::StringHashContinue(uVar10,IVar12.begin,IVar12.end);
    anon_unknown.dwarf_b837c::LookupFunctionChainByName(&local_78,local_40,uVar10);
    while (local_78.node.node != (Node *)0x0) {
      if ((((!noArguments) || (*(int *)(*(long *)(local_78.node.node + 0x10) + 0x78) == 0)) ||
          (pAVar11 = SmallArray<ArgumentData,_4U>::operator[]
                               ((SmallArray<ArgumentData,_4U> *)
                                (*(long *)(local_78.node.node + 0x10) + 0x70),0),
          pAVar11->value != (ExprBase *)0x0)) &&
         (uVar3 = functions->data, uVar4 = functions->count, functions_01.count = uVar4,
         functions_01.data = (FunctionData **)uVar3, functions_01._12_4_ = 0,
         bVar9 = ContainsSameOverload(functions_01,*(FunctionData **)(local_78.node.node + 0x10)),
         !bVar9)) {
        local_58.node.start = *(Node **)(local_78.node.node + 0x10);
        SmallArray<FunctionData_*,_32U>::push_back(functions,(FunctionData **)&local_58);
      }
      anon_unknown.dwarf_b837c::FunctionLookupChain::next(&local_58,&local_78);
      local_78.node.start = local_58.node.start;
      local_78.node.node = local_58.node.node;
    }
  }
  uVar10 = NULLC::StringHashContinue(local_34,"$");
  anon_unknown.dwarf_b837c::LookupFunctionChainByName(&local_78,local_40,uVar10);
  while (local_78.node.node != (Node *)0x0) {
    if ((((!noArguments) || (*(int *)(*(long *)(local_78.node.node + 0x10) + 0x78) == 0)) ||
        (pAVar11 = SmallArray<ArgumentData,_4U>::operator[]
                             ((SmallArray<ArgumentData,_4U> *)
                              (*(long *)(local_78.node.node + 0x10) + 0x70),0),
        pAVar11->value != (ExprBase *)0x0)) &&
       (((*(FunctionData **)(local_78.node.node + 0x10))->scope->ownerType == type &&
        (uVar5 = functions->data, uVar6 = functions->count, functions_02.count = uVar6,
        functions_02.data = (FunctionData **)uVar5, functions_02._12_4_ = 0,
        bVar9 = ContainsSameOverload(functions_02,*(FunctionData **)(local_78.node.node + 0x10)),
        !bVar9)))) {
      local_58.node.start = *(Node **)(local_78.node.node + 0x10);
      SmallArray<FunctionData_*,_32U>::push_back(functions,(FunctionData **)&local_58);
    }
    anon_unknown.dwarf_b837c::FunctionLookupChain::next(&local_58,&local_78);
    local_78.node.start = local_58.node.start;
    local_78.node.node = local_58.node.node;
  }
  if (local_80 != (TypeGenericClassProto *)0x0) {
    uVar10 = NULLC::StringHashContinue((local_80->super_TypeBase).nameHash,"::");
    IVar12 = GetTypeConstructorName(local_80);
    uVar10 = NULLC::StringHashContinue(uVar10,IVar12.begin,IVar12.end);
    uVar10 = NULLC::StringHashContinue(uVar10,"$");
    anon_unknown.dwarf_b837c::LookupFunctionChainByName(&local_78,local_40,uVar10);
    while (local_78.node.node != (Node *)0x0) {
      if ((((!noArguments) || (*(int *)(*(long *)(local_78.node.node + 0x10) + 0x78) == 0)) ||
          (pAVar11 = SmallArray<ArgumentData,_4U>::operator[]
                               ((SmallArray<ArgumentData,_4U> *)
                                (*(long *)(local_78.node.node + 0x10) + 0x70),0),
          pAVar11->value != (ExprBase *)0x0)) &&
         (uVar7 = functions->data, uVar8 = functions->count, functions_03.count = uVar8,
         functions_03.data = (FunctionData **)uVar7, functions_03._12_4_ = 0,
         bVar9 = ContainsSameOverload(functions_03,*(FunctionData **)(local_78.node.node + 0x10)),
         !bVar9)) {
        local_58.node.start = *(Node **)(local_78.node.node + 0x10);
        SmallArray<FunctionData_*,_32U>::push_back(functions,(FunctionData **)&local_58);
      }
      anon_unknown.dwarf_b837c::FunctionLookupChain::next(&local_58,&local_78);
      local_78.node.start = local_58.node.start;
      local_78.node.node = local_58.node.node;
    }
  }
  return functions->count != 0;
}

Assistant:

bool GetTypeConstructorFunctions(ExpressionContext &ctx, TypeBase *type, bool noArguments, SmallArray<FunctionData*, 32> &functions)
{
	TypeClass *classType = getType<TypeClass>(type);
	TypeGenericClassProto *typeGenericClassProto = getType<TypeGenericClassProto>(type);

	if(classType && classType->proto)
		typeGenericClassProto = classType->proto;

	unsigned hash = NULLC::StringHashContinue(type->nameHash, "::");

	if(classType)
	{
		InplaceStr functionName = GetTypeConstructorName(classType);

		hash = NULLC::StringHashContinue(hash, functionName.begin, functionName.end);
	}
	else
	{
		hash = NULLC::StringHashContinue(hash, type->name.begin, type->name.end);
	}

	for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, hash); chain; chain = chain.next())
	{
		if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
			continue;

		if(chain->scope->ownerType != type)
			continue;

		if(!ContainsSameOverload(functions, *chain))
			functions.push_back(*chain);
	}

	if(typeGenericClassProto)
	{
		// Look for a member function in a generic class base and instantiate them
		unsigned hash = NULLC::StringHashContinue(typeGenericClassProto->nameHash, "::");

		InplaceStr functionName = GetTypeConstructorName(typeGenericClassProto);

		hash = NULLC::StringHashContinue(hash, functionName.begin, functionName.end);

		for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, hash); chain; chain = chain.next())
		{
			if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
				continue;

			if(!ContainsSameOverload(functions, *chain))
				functions.push_back(*chain);
		}
	}

	for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, NULLC::StringHashContinue(hash, "$")); chain; chain = chain.next())
	{
		if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
			continue;

		if(chain->scope->ownerType != type)
			continue;

		if(!ContainsSameOverload(functions, *chain))
			functions.push_back(*chain);
	}

	if(typeGenericClassProto)
	{
		// Look for a member function in a generic class base and instantiate them
		unsigned hash = NULLC::StringHashContinue(typeGenericClassProto->nameHash, "::");

		InplaceStr functionName = GetTypeConstructorName(typeGenericClassProto);

		hash = NULLC::StringHashContinue(hash, functionName.begin, functionName.end);

		for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, NULLC::StringHashContinue(hash, "$")); chain; chain = chain.next())
		{
			if(noArguments && !chain->arguments.empty() && !chain->arguments[0].value)
				continue;

			if(!ContainsSameOverload(functions, *chain))
				functions.push_back(*chain);
		}
	}

	return !functions.empty();
}